

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

fdb_status fdb_cancel_compaction(fdb_file_handle *fhandle)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  uint sleep_time;
  uint local_14;
  
  if (fhandle == (fdb_file_handle *)0x0) {
    fVar2 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    pfVar1 = fhandle->root;
    filemgr_mutex_lock(pfVar1->file);
    filemgr_set_cancel_compaction(pfVar1->file,true);
    if ((pfVar1->file->status).super___atomic_base<unsigned_char>._M_i == '\x01') {
      do {
        filemgr_mutex_unlock(pfVar1->file);
        decaying_usleep(&local_14,1000000);
        filemgr_mutex_lock(pfVar1->file);
      } while ((pfVar1->file->status).super___atomic_base<unsigned_char>._M_i == '\x01');
    }
    fVar2 = FDB_RESULT_SUCCESS;
    filemgr_set_cancel_compaction(pfVar1->file,false);
    filemgr_mutex_unlock(pfVar1->file);
  }
  return fVar2;
}

Assistant:

LIBFDB_API
fdb_status fdb_cancel_compaction(fdb_file_handle *fhandle)
{
    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_kvs_handle *super_handle = fhandle->root;

    filemgr_mutex_lock(super_handle->file);
    filemgr_set_cancel_compaction(super_handle->file, true);

    // TODO: Find a better way of cacncelling the ongoing compaction task.
    unsigned int sleep_time = 10000; // 10 ms.
    file_status_t fstatus = filemgr_get_file_status(super_handle->file);
    while (fstatus == FILE_COMPACT_OLD) {
        filemgr_mutex_unlock(super_handle->file);
        decaying_usleep(&sleep_time, 1000000);
        filemgr_mutex_lock(super_handle->file);
        fstatus = filemgr_get_file_status(super_handle->file);
    }
    filemgr_set_cancel_compaction(super_handle->file, false);
    filemgr_mutex_unlock(super_handle->file);
    return FDB_RESULT_SUCCESS;
}